

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1280,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  pfHash p_Var4;
  reference pvVar5;
  size_type sVar6;
  byte in_CL;
  uint in_EDX;
  char *pcVar7;
  uint in_ESI;
  undefined8 in_RDI;
  byte in_R8B;
  byte in_R9B;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *unaff_retaddr;
  bool result;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  undefined4 in_stack_ffffffffffffff28;
  byte bVar8;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  pfHash in_stack_ffffffffffffff40;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [3];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar7 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar7 = "up to";
  }
  _local_8 = in_RDI;
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x500,pcVar7,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x1603ef);
  Blob<1280>::Blob((Blob<1280> *)&stack0xffffffffffffff38);
  memset(&stack0xffffffffffffff38,0,0xa0);
  if ((local_d & 1) != 0) {
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    p_Var4 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar5 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](&local_28,0);
    (*p_Var4)(&stack0xffffffffffffff38,0xa0,0,pvVar5);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1280>,Blob<128>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (bool)in_stack_ffffffffffffff37,
             (Blob<1280> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  sVar6 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar6 & 0xffffffff);
  uVar2 = _local_8;
  bVar8 = 1;
  uVar1 = (ulong)_local_8 >> 0x38;
  bVar3 = TestHashList<Blob<128>>
                    (unaff_retaddr,SUB81(uVar1,0),SUB81((ulong)uVar2 >> 0x30,0),
                     SUB81((ulong)uVar2 >> 0x28,0),SUB81((ulong)uVar2 >> 0x20,0),
                     SUB81((ulong)uVar2 >> 0x18,0));
  bVar8 = bVar3 & bVar8;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar8 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}